

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_matching
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  undefined8 uVar1;
  bool bVar2;
  ContextType ctxType;
  GLuint shader;
  GLuint program;
  GLuint shader_00;
  char *__s;
  SsboArgs *in_RCX;
  SsboArgs *args;
  long lVar3;
  TestLog *in_R8;
  TestLog *log;
  long *plVar4;
  SsboArgs *pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string shaderFragmentString;
  string message;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  GLint linkStatus;
  string shaderVertexString;
  char *shaderFragmentCharPtr;
  char *shaderVertexCharPtr;
  string versionString;
  SsboArgData argDataArrayFrag [8];
  SsboArgs ssboArgs;
  string local_5d0;
  char *local_5b0;
  long local_5a8;
  char local_5a0;
  undefined7 uStack_59f;
  TestLog *local_590;
  ArgMember local_588 [8];
  string local_568;
  undefined1 local_548 [32];
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  string local_508;
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  SsboArgs *local_4c0;
  undefined1 local_4b8 [16];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  long *local_428;
  long local_420;
  long local_418 [2];
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8 [6];
  ios_base local_390 [264];
  SsboArgData local_288;
  SsboArgData local_260;
  SsboArgData local_238;
  SsboArgData local_210;
  SsboArgData local_1e8;
  SsboArgData local_1c0;
  SsboArgData local_198;
  SsboArgData local_170;
  undefined1 local_148 [280];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_590 = (ctx->super_CallLogWrapper).m_log;
  local_5b0 = &local_5a0;
  local_5a8 = 0;
  local_5a0 = '\0';
  __s = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,__s,(allocator<char> *)local_408);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,local_428,local_420 + (long)local_428);
  anon_unknown_0::args::SsboArgs::SsboArgs((SsboArgs *)(local_148 + 8),&local_448,local_590);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_528._M_p = (pointer)&local_518;
  local_520 = 0;
  local_518._M_local_buf[0] = '\0';
  local_588[7] = 0;
  local_408._0_8_ = local_408 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"std140","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_288,local_588 + 7,(string *)local_408);
  local_588[6] = 1;
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"10","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_260,local_588 + 6,&local_5d0);
  local_588[5] = 2;
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"row_major","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_238,local_588 + 5,&local_568);
  local_588[4] = 3;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vec2","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_210,local_588 + 4,&local_508);
  local_588[3] = 4;
  local_548._0_8_ = local_548 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"name_changed","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_1e8,local_588 + 3,(string *)local_548);
  local_588[2] = 5;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"20","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_1c0,local_588 + 2,&local_468);
  local_588[1] = 6;
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"5","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_198,local_588 + 1,&local_488);
  local_588[0] = ARGMEMBER_REORDER;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"true","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_170,local_588,&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
    operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,
                    CONCAT71(local_5d0.field_2._M_allocated_capacity._1_7_,
                             local_5d0.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
    operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&local_568,&local_288,(SsboArgData *)local_148,(allocator_type *)in_RCX);
  (anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
            ((string *)local_408,(_anonymous_namespace_ *)0x8b31,(int)local_148 + 8,in_RCX,in_R8);
  std::__cxx11::string::operator=((string *)&local_528,(string *)local_408);
  if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
    operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
  }
  local_4b8._8_8_ = local_528._M_p;
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  std::__cxx11::string::_M_assign((string *)&local_5b0);
  this = (ostringstream *)(local_408 + 8);
  local_408._0_8_ = local_590;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_5b0,local_5a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_390);
  log = (TestLog *)0x0;
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,shader,1,(GLchar **)(local_4b8 + 8),(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
  if (local_568._M_string_length - (long)local_568._M_dataplus._M_p != 0) {
    args = (SsboArgs *)
           (((long)(local_568._M_string_length - (long)local_568._M_dataplus._M_p) >> 3) *
           -0x3333333333333333);
    plVar4 = (long *)(local_568._M_dataplus._M_p + 0x10);
    pSVar5 = (SsboArgs *)0x0;
    local_4c0 = args;
    do {
      local_548._0_4_ = 0xffffffff;
      local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
      local_5d0._M_string_length = 0;
      local_5d0.field_2._M_local_buf[0] = '\0';
      local_408._0_8_ = local_408 + 0x10;
      local_4b8._0_8_ = pSVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,
                 "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
                 ,"");
      NegativeTestContext::beginSection(ctx,(string *)local_408);
      if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
      anon_unknown_0::args::SsboArgs::setDefaultValues((SsboArgs *)(local_148 + 8));
      local_4e8._0_4_ = *(undefined4 *)(plVar4 + -2);
      local_4e0._M_p = (pointer)&local_4d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,plVar4[-1],*plVar4 + plVar4[-1]);
      anon_unknown_0::args::SsboArgs::setSingleValue
                ((SsboArgs *)(local_148 + 8),(SsboArgData *)local_4e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_p != &local_4d0) {
        operator_delete(local_4e0._M_p,local_4d0._M_allocated_capacity + 1);
      }
      (anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
                ((string *)local_408,(_anonymous_namespace_ *)0x8b30,(int)local_148 + 8,args,log);
      std::__cxx11::string::operator=((string *)&local_5d0,(string *)local_408);
      if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      local_508._M_dataplus._M_p = local_5d0._M_dataplus._M_p;
      shader_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
      std::__cxx11::string::_M_assign((string *)&local_5b0);
      local_408._0_8_ = local_590;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_408 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_408 + 8),local_5b0,local_5a8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_408 + 8));
      std::ios_base::~ios_base(local_390);
      log = (TestLog *)0x0;
      glu::CallLogWrapper::glShaderSource
                (&ctx->super_CallLogWrapper,shader_00,1,(GLchar **)&local_508,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader_00);
      glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader);
      glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader_00);
      glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program);
      args = (SsboArgs *)local_548;
      glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,program,0x8b82,(GLint *)args);
      logProgramInfo(ctx,program);
      if (local_548._0_4_ == 1) {
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,"Program should not have linked","");
        NegativeTestContext::fail(ctx,(string *)local_408);
        if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
        }
      }
      glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader_00);
      glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
      NegativeTestContext::endSection(ctx);
      uVar1 = local_4b8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
        operator_delete(local_5d0._M_dataplus._M_p,
                        CONCAT71(local_5d0.field_2._M_allocated_capacity._1_7_,
                                 local_5d0.field_2._M_local_buf[0]) + 1);
      }
      pSVar5 = (SsboArgs *)(uVar1 + 1);
      plVar4 = plVar4 + 5;
    } while (pSVar5 < local_4c0);
  }
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)&local_568);
  lVar3 = -0x140;
  paVar6 = &local_170.data.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -5);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_p != &local_518) {
    operator_delete(local_528._M_p,
                    CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]) + 1);
  }
  anon_unknown_0::args::SsboArgs::~SsboArgs((SsboArgs *)(local_148 + 8));
  if (local_428 != local_418) {
    operator_delete(local_428,local_418[0] + 1);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0,CONCAT71(uStack_59f,local_5a0) + 1);
  }
  return;
}

Assistant:

void ssbo_block_matching(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// List of arguments used to create varying ssbo objects in the fragment shader
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"std140"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"10"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_MEMBER_TYPE,		"vec2"),
													args::SsboArgData(args::ARGMEMBER_NAME,				"name_changed"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"5"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"true") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); ++idx)
	{
		GLint			linkStatus				=	-1;
		GLint			program;
		GLint			shaderFragmentGL;
		std::string		shaderFragmentString;
		const char*		shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.resetValues();
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}